

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypeHandler.cpp
# Opt level: O0

void Js::DynamicTypeHandler::AdjustSlots
               (DynamicObject *object,PropertyIndex newInlineSlotCapacity,int newAuxSlotCapacity)

{
  code *pcVar1;
  DynamicObject *pDVar2;
  bool bVar3;
  PropertyIndex PVar4;
  uint16 uVar5;
  int iVar6;
  uint uVar7;
  undefined4 *puVar8;
  Recycler *this;
  WriteBarrierPtr<void> **ppWVar9;
  uint uVar10;
  nullptr_t local_90;
  ushort local_82;
  DynamicObject *pDStack_80;
  PropertyIndex i_1;
  Type *newInlineSlots;
  Var *oldInlineSlots;
  WriteBarrierPtr<void> *pWStack_68;
  int i;
  Type *oldAuxSlots;
  int oldAuxSlotCapacity;
  PropertyIndex oldInlineSlotCapacity;
  DynamicTypeHandler *oldTypeHandler;
  Type *newAuxSlots;
  Recycler *local_20;
  Recycler *recycler;
  int newAuxSlotCapacity_local;
  PropertyIndex newInlineSlotCapacity_local;
  DynamicObject *object_local;
  
  recycler._0_4_ = newAuxSlotCapacity;
  recycler._6_2_ = newInlineSlotCapacity;
  _newAuxSlotCapacity_local = object;
  if (object == (DynamicObject *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar8 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/TypeHandler.cpp"
                                ,0x2a8,"(object)","object");
    if (!bVar3) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar8 = 0;
  }
  this = RecyclableObject::GetRecycler(&_newAuxSlotCapacity_local->super_RecyclableObject);
  local_20 = this;
  Memory::TrackAllocData::CreateTrackAllocData
            ((TrackAllocData *)&newAuxSlots,(type_info *)&void*::typeinfo,0,(long)(int)recycler,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/TypeHandler.cpp"
             ,0x2ac);
  Memory::Recycler::TrackAllocInfo(this,(TrackAllocData *)&newAuxSlots);
  oldTypeHandler =
       (DynamicTypeHandler *)Memory::Recycler::AllocZero(local_20,(long)(int)recycler << 3);
  _oldAuxSlotCapacity = DynamicObject::GetTypeHandler(_newAuxSlotCapacity_local);
  oldAuxSlots._6_2_ = GetInlineSlotCapacity(_oldAuxSlotCapacity);
  if (oldAuxSlots._6_2_ == recycler._6_2_) {
    iVar6 = GetSlotCapacity(_oldAuxSlotCapacity);
    oldAuxSlots._0_4_ = iVar6 - (uint)oldAuxSlots._6_2_;
    if ((int)recycler <= (int)oldAuxSlots) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar8 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/TypeHandler.cpp"
                                  ,0x2b5,"(oldAuxSlotCapacity < newAuxSlotCapacity)",
                                  "oldAuxSlotCapacity < newAuxSlotCapacity");
      if (!bVar3) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar8 = 0;
    }
    if (0 < (int)oldAuxSlots) {
      ppWVar9 = Memory::WriteBarrierPtr::operator_cast_to_WriteBarrierPtr__
                          ((WriteBarrierPtr *)&_newAuxSlotCapacity_local->auxSlots);
      pWStack_68 = *ppWVar9;
      if (pWStack_68 == (WriteBarrierPtr<void> *)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar8 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/TypeHandler.cpp"
                                    ,0x2ba,"(oldAuxSlots)","oldAuxSlots");
        if (!bVar3) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar8 = 0;
      }
      oldInlineSlots._4_4_ = 0;
      do {
        Memory::WriteBarrierPtr<void>::operator=
                  ((WriteBarrierPtr<void> *)
                   (&oldTypeHandler->_vptr_DynamicTypeHandler + oldInlineSlots._4_4_),
                   pWStack_68 + oldInlineSlots._4_4_);
        oldInlineSlots._4_4_ = oldInlineSlots._4_4_ + 1;
      } while (oldInlineSlots._4_4_ < (int)oldAuxSlots);
    }
    Memory::WriteBarrierPtr<Memory::WriteBarrierPtr<void>_>::operator=
              (&_newAuxSlotCapacity_local->auxSlots,(WriteBarrierPtr<void> *)oldTypeHandler);
  }
  else {
    bVar3 = IsObjectHeaderInlinedTypeHandler(_oldAuxSlotCapacity);
    if (!bVar3) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar8 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/TypeHandler.cpp"
                                  ,0x2cc,"(oldTypeHandler->IsObjectHeaderInlinedTypeHandler())",
                                  "oldTypeHandler->IsObjectHeaderInlinedTypeHandler()");
      if (!bVar3) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar8 = 0;
    }
    if (oldAuxSlots._6_2_ <= recycler._6_2_) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar8 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/TypeHandler.cpp"
                                  ,0x2cd,"(oldInlineSlotCapacity > newInlineSlotCapacity)",
                                  "oldInlineSlotCapacity > newInlineSlotCapacity");
      if (!bVar3) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar8 = 0;
    }
    uVar7 = (uint)oldAuxSlots._6_2_;
    uVar10 = (uint)recycler._6_2_;
    PVar4 = GetObjectHeaderInlinableSlotCapacity();
    if (uVar7 - uVar10 != (uint)PVar4) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar8 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/TypeHandler.cpp"
                                  ,0x2ce,
                                  "(oldInlineSlotCapacity - newInlineSlotCapacity == DynamicTypeHandler::GetObjectHeaderInlinableSlotCapacity())"
                                  ,
                                  "oldInlineSlotCapacity - newInlineSlotCapacity == DynamicTypeHandler::GetObjectHeaderInlinableSlotCapacity()"
                                 );
      if (!bVar3) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar8 = 0;
    }
    iVar6 = (int)recycler;
    PVar4 = GetObjectHeaderInlinableSlotCapacity();
    if (iVar6 < (int)(uint)PVar4) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar8 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/TypeHandler.cpp"
                                  ,0x2cf,
                                  "(newAuxSlotCapacity >= DynamicTypeHandler::GetObjectHeaderInlinableSlotCapacity())"
                                  ,
                                  "newAuxSlotCapacity >= DynamicTypeHandler::GetObjectHeaderInlinableSlotCapacity()"
                                 );
      if (!bVar3) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar8 = 0;
    }
    bVar3 = Phases::IsEnabled((Phases *)&DAT_01ec1678,ObjectHeaderInliningPhase);
    if (bVar3) {
      Output::Print(L"ObjectHeaderInlining: Moving inlined properties to aux slots.\n");
      Output::Flush();
    }
    pDVar2 = _newAuxSlotCapacity_local;
    uVar5 = GetOffsetOfObjectHeaderInlineSlots();
    newInlineSlots =
         (Type *)((long)&(pDVar2->super_RecyclableObject).super_FinalizableObject.
                         super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject + (ulong)uVar5);
    PVar4 = GetObjectHeaderInlinableSlotCapacity();
    if (PVar4 != 2) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar8 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/TypeHandler.cpp"
                                  ,0x2da,
                                  "(DynamicTypeHandler::GetObjectHeaderInlinableSlotCapacity() == 2)"
                                  ,"DynamicTypeHandler::GetObjectHeaderInlinableSlotCapacity() == 2"
                                 );
      if (!bVar3) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar8 = 0;
    }
    Memory::WriteBarrierPtr<void>::operator=
              ((WriteBarrierPtr<void> *)oldTypeHandler,
               newInlineSlots[(int)(oldAuxSlots._6_2_ - 2)].ptr);
    Memory::WriteBarrierPtr<void>::operator=
              ((WriteBarrierPtr<void> *)&oldTypeHandler->propertyTypes,
               newInlineSlots[(int)(oldAuxSlots._6_2_ - 1)].ptr);
    if (recycler._6_2_ != 0) {
      bVar3 = Phases::IsEnabled((Phases *)&DAT_01ec1678,ObjectHeaderInliningPhase);
      if (bVar3) {
        Output::Print(L"ObjectHeaderInlining: Moving inlined properties out of the object header.\n"
                     );
        Output::Flush();
      }
      pDStack_80 = _newAuxSlotCapacity_local + 1;
      local_82 = recycler._6_2_;
      do {
        local_82 = local_82 - 1;
        Memory::WriteBarrierPtr<void>::operator=
                  ((WriteBarrierPtr<void> *)
                   (&(pDStack_80->super_RecyclableObject).super_FinalizableObject + local_82),
                   newInlineSlots[local_82].ptr);
      } while (local_82 != 0);
    }
    Memory::WriteBarrierPtr<Memory::WriteBarrierPtr<void>_>::operator=
              (&_newAuxSlotCapacity_local->auxSlots,(WriteBarrierPtr<void> *)oldTypeHandler);
    local_90 = (nullptr_t)0x0;
    Memory::WriteBarrierPtr<Js::ArrayObject>::operator=
              (&(_newAuxSlotCapacity_local->field_1).objectArray,&local_90);
  }
  return;
}

Assistant:

void DynamicTypeHandler::AdjustSlots(
        DynamicObject *const object,
        const PropertyIndex newInlineSlotCapacity,
        const int newAuxSlotCapacity)
    {
        Assert(object);

        // Allocate new aux slot array
        Recycler *const recycler = object->GetRecycler();
        TRACK_ALLOC_INFO(recycler, Var, Recycler, 0, newAuxSlotCapacity);
        Field(Var) *const newAuxSlots = reinterpret_cast<Field(Var) *>(
            recycler->AllocZero(newAuxSlotCapacity * sizeof(Field(Var))));

        DynamicTypeHandler *const oldTypeHandler = object->GetTypeHandler();
        const PropertyIndex oldInlineSlotCapacity = oldTypeHandler->GetInlineSlotCapacity();
        if(oldInlineSlotCapacity == newInlineSlotCapacity)
        {
            const int oldAuxSlotCapacity = oldTypeHandler->GetSlotCapacity() - oldInlineSlotCapacity;
            AssertOrFailFast(oldAuxSlotCapacity < newAuxSlotCapacity);
            if(oldAuxSlotCapacity > 0)
            {
                // Copy aux slots to the new array
                Field(Var) *const oldAuxSlots = object->auxSlots;
                Assert(oldAuxSlots);
                int i = 0;
                do
                {
                    newAuxSlots[i] = oldAuxSlots[i];
                } while(++i < oldAuxSlotCapacity);

            #ifdef EXPLICIT_FREE_SLOTS
                recycler->ExplicitFreeNonLeaf(oldAuxSlots, oldAuxSlotCapacity * sizeof(Var));
            #endif
            }

            object->auxSlots = newAuxSlots;
            return;
        }

        // An object header-inlined type handler is transitioning into one that is not. Some inline slots need to move, and
        // there are no old aux slots that need to be copied.
        Assert(oldTypeHandler->IsObjectHeaderInlinedTypeHandler());
        Assert(oldInlineSlotCapacity > newInlineSlotCapacity);
        Assert(oldInlineSlotCapacity - newInlineSlotCapacity == DynamicTypeHandler::GetObjectHeaderInlinableSlotCapacity());
        Assert(newAuxSlotCapacity >= DynamicTypeHandler::GetObjectHeaderInlinableSlotCapacity());

        // Move the last few inline slots into the aux slots
        if(PHASE_TRACE1(Js::ObjectHeaderInliningPhase))
        {
            Output::Print(_u("ObjectHeaderInlining: Moving inlined properties to aux slots.\n"));
            Output::Flush();
        }
        Var *const oldInlineSlots =
            reinterpret_cast<Var *>(
                reinterpret_cast<uintptr_t>(object) + DynamicTypeHandler::GetOffsetOfObjectHeaderInlineSlots());
        Assert(DynamicTypeHandler::GetObjectHeaderInlinableSlotCapacity() == 2);
        newAuxSlots[0] = oldInlineSlots[oldInlineSlotCapacity - 2];
        newAuxSlots[1] = oldInlineSlots[oldInlineSlotCapacity - 1];

        if(newInlineSlotCapacity > 0)
        {
            // Move the remaining inline slots such that none are object header-inlined. Copy backwards, as the two buffers may
            // overlap, with the new inline slot array starting beyond the start of the old inline slot array.
            if(PHASE_TRACE1(Js::ObjectHeaderInliningPhase))
            {
                Output::Print(_u("ObjectHeaderInlining: Moving inlined properties out of the object header.\n"));
                Output::Flush();
            }
            Field(Var) *const newInlineSlots = reinterpret_cast<Field(Var) *>(object + 1);
            PropertyIndex i = newInlineSlotCapacity;
            do
            {
                --i;
                newInlineSlots[i] = oldInlineSlots[i];
            } while(i > 0);
        }

        object->auxSlots = newAuxSlots;
        object->objectArray = nullptr;
    }